

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageAnalyzer.cpp
# Opt level: O0

void __thiscall pageAnalyzer::pageAnalyzer(pageAnalyzer *this,string *inputPage)

{
  string *inputPage_local;
  pageAnalyzer *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->pageContent);
  std::__cxx11::string::operator=((string *)this,(string *)inputPage);
  decomposePageContent(this);
  return;
}

Assistant:

pageAnalyzer::pageAnalyzer(const std::string &inputPage)
{
    this->inputPage = inputPage;
    this->decomposePageContent();
}